

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# commissioner_impl.cpp
# Opt level: O2

Error * ot::commissioner::CommissionerImpl::MakeChannelMask
                  (Error *__return_storage_ptr__,ByteArray *aBuf,uint32_t aChannelMask)

{
  undefined4 uVar1;
  char *begin;
  char *pcVar2;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v10::basic_format_context<fmt::v10::appender,_char>_>_2
  in_R9;
  format_args args;
  initializer_list<ot::commissioner::ChannelMaskEntry> __l;
  allocator_type local_c1;
  string local_c0;
  ChannelMaskEntry entry;
  undefined1 local_80 [8];
  _Vector_base<unsigned_char,_std::allocator<unsigned_char>_> local_78;
  undefined1 local_58 [8];
  char *local_50;
  size_type local_48;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_40;
  parse_func local_30 [1];
  
  __return_storage_ptr__->mCode = kNone;
  (__return_storage_ptr__->mMessage)._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->mMessage).field_2;
  (__return_storage_ptr__->mMessage)._M_string_length = 0;
  (__return_storage_ptr__->mMessage).field_2._M_local_buf[0] = '\0';
  entry.mMasks.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  entry.mMasks.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  entry.mMasks.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  if ((aChannelMask & 0x7fff800) != 0) {
    entry.mPage = '\0';
    utils::Encode<unsigned_int>(&entry.mMasks,0x7fff800);
    if (entry.mMasks.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start !=
        entry.mMasks.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_finish) {
      ChannelMaskEntry::ChannelMaskEntry((ChannelMaskEntry *)local_80,&entry);
      __l._M_len = 1;
      __l._M_array = (iterator)local_80;
      std::
      vector<ot::commissioner::ChannelMaskEntry,_std::allocator<ot::commissioner::ChannelMaskEntry>_>
      ::vector((vector<ot::commissioner::ChannelMaskEntry,_std::allocator<ot::commissioner::ChannelMaskEntry>_>
                *)&local_c0,__l,&local_c1);
      EncodeChannelMask((Error *)local_58,aBuf,(ChannelMask *)&local_c0);
      uVar1 = local_58._0_4_;
      std::__cxx11::string::~string((string *)&local_50);
      std::
      vector<ot::commissioner::ChannelMaskEntry,_std::allocator<ot::commissioner::ChannelMaskEntry>_>
      ::~vector((vector<ot::commissioner::ChannelMaskEntry,_std::allocator<ot::commissioner::ChannelMaskEntry>_>
                 *)&local_c0);
      std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base(&local_78);
      if (uVar1 != none_type) {
        abort();
      }
      goto LAB_00178241;
    }
  }
  local_58._0_4_ = none_type;
  local_50 = "no valid Channel Masks provided";
  local_48 = 0x1f;
  local_40._M_allocated_capacity = 0;
  local_30[0] = (parse_func)0x0;
  pcVar2 = "no valid Channel Masks provided";
  local_40._8_8_ = (format_string_checker<char> *)local_58;
  while (begin = pcVar2, begin != "") {
    pcVar2 = begin + 1;
    if (*begin == '}') {
      if ((pcVar2 == "") || (*pcVar2 != '}')) {
        ::fmt::v10::detail::throw_format_error("unmatched \'}\' in format string");
      }
      pcVar2 = begin + 2;
    }
    else if (*begin == '{') {
      pcVar2 = ::fmt::v10::detail::
               parse_replacement_field<char,fmt::v10::detail::format_string_checker<char>&>
                         (begin,"",(format_string_checker<char> *)local_58);
    }
  }
  args.field_1.args_ = in_R9.args_;
  args.desc_ = (unsigned_long_long)local_58;
  ::fmt::v10::vformat_abi_cxx11_
            (&local_c0,(v10 *)"no valid Channel Masks provided",(string_view)ZEXT816(0x1f),args);
  local_80._0_4_ = kInvalidArgs;
  std::__cxx11::string::string((string *)&local_78,(string *)&local_c0);
  Error::operator=(__return_storage_ptr__,(Error *)local_80);
  std::__cxx11::string::~string((string *)&local_78);
  std::__cxx11::string::~string((string *)&local_c0);
LAB_00178241:
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            (&entry.mMasks.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>);
  return __return_storage_ptr__;
}

Assistant:

Error CommissionerImpl::MakeChannelMask(ByteArray &aBuf, uint32_t aChannelMask)
{
    Error            error;
    ChannelMaskEntry entry;

    if (kRadio915Mhz)
    {
        if (aChannelMask & kRadio915MhzOqpskChannelMask)
        {
            entry.mPage = kRadioChannelPage2;
            utils::Encode(entry.mMasks, kRadio915MhzOqpskChannelMask);
        }
    }
    else
    {
        if (aChannelMask & kRadio2P4GhzOqpskChannelMask)
        {
            entry.mPage = kRadioChannelPage0;
            utils::Encode(entry.mMasks, kRadio2P4GhzOqpskChannelMask);
        }
    }

    VerifyOrExit(!entry.mMasks.empty(), error = ERROR_INVALID_ARGS("no valid Channel Masks provided"));
    SuccessOrDie(EncodeChannelMask(aBuf, {entry}));

exit:
    return error;
}